

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_Ntk4CollectAdd(Acb_Ntk_t *pNtk,int iObj,Vec_Int_t *vRes,Vec_Int_t *vDists,int Dist)

{
  int iVar1;
  int Dist_local;
  Vec_Int_t *vDists_local;
  Vec_Int_t *vRes_local;
  int iObj_local;
  Acb_Ntk_t *pNtk_local;
  
  iVar1 = Acb_ObjSetTravIdCur(pNtk,iObj);
  if (iVar1 == 0) {
    Vec_IntWriteEntry(vDists,iObj,Dist);
    Vec_IntPush(vRes,iObj);
  }
  return;
}

Assistant:

void Acb_Ntk4CollectAdd( Acb_Ntk_t * pNtk, int iObj, Vec_Int_t * vRes, Vec_Int_t * vDists, int Dist )
{
    if ( Acb_ObjSetTravIdCur(pNtk, iObj) )
        return;
    Vec_IntWriteEntry( vDists, iObj, Dist );
    Vec_IntPush( vRes, iObj );
}